

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::SetCacheEntryValue(cmState *this,string *key,string *value)

{
  string *value_local;
  string *key_local;
  cmState *this_local;
  
  cmCacheManager::SetCacheEntryValue(this->CacheManager,key,value);
  return;
}

Assistant:

void cmState::SetCacheEntryValue(std::string const& key,
                                 std::string const& value)
{
  this->CacheManager->SetCacheEntryValue(key, value);
}